

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::setPlaceholderText(QLineEdit *this,QString *placeholderText)

{
  QString *lhs;
  QLineEditPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  lhs = &this_00->placeholderText;
  bVar1 = ::operator!=(lhs,placeholderText);
  if (bVar1) {
    QString::operator=(lhs,(QString *)placeholderText);
    bVar1 = QLineEditPrivate::shouldShowPlaceholderText(this_00);
    if (bVar1) {
      QWidget::update(&this->super_QWidget);
      return;
    }
  }
  return;
}

Assistant:

void QLineEdit::setPlaceholderText(const QString& placeholderText)
{
    Q_D(QLineEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        if (d->shouldShowPlaceholderText())
            update();
    }
}